

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseColEtree.h
# Opt level: O3

void Eigen::internal::treePostorder<int,Eigen::Matrix<int,_1,1,0,_1,1>>
               (int n,Matrix<int,__1,_1,_0,__1,_1> *parent,Matrix<int,__1,_1,_0,__1,_1> *post)

{
  uint uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  DenseIndex DVar5;
  Index size;
  int *piVar6;
  undefined8 *puVar7;
  Index index;
  ulong uVar8;
  long lVar9;
  long lVar10;
  Index size_1;
  ulong uVar11;
  undefined8 local_68;
  int local_5c;
  DenseStorage<int,__1,__1,_1,_0> local_58;
  DenseStorage<int,__1,__1,_1,_0> local_48;
  
  local_48.m_data = (int *)0x0;
  local_48.m_rows = 0;
  local_58.m_data = (int *)0x0;
  local_58.m_rows = 0;
  if (n < -1) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/PlainObjectBase.h"
                  ,0x10c,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<int, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<int, -1, 1>]"
                 );
  }
  uVar1 = n + 1;
  uVar11 = (ulong)(int)uVar1;
  if (uVar1 == 0) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar11;
    local_48 = (DenseStorage<int,__1,__1,_1,_0>)(auVar3 << 0x40);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar11;
    local_58 = (DenseStorage<int,__1,__1,_1,_0>)(auVar4 << 0x40);
    uVar8 = 0;
    piVar6 = (int *)0x0;
LAB_0014ce9a:
    if (uVar8 != uVar11) {
      memset((void *)((long)piVar6 + (uVar11 * 4 & 0xfffffffffffffff0)),0,
             (ulong)((uint)(uVar11 * 4) & 0xc));
    }
    PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
              (&post->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,uVar11);
    local_68 = (post->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    local_5c = 0;
    if (-1 < (long)local_68) {
      PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
      resizeLike<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,Eigen::Matrix<int,_1,1,0,_1,1>>>
                ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)post,
                 (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                  *)&local_68);
      uVar11 = (post->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
      if (uVar11 != local_68) {
        __assert_fail("rows() == other.rows() && cols() == other.cols()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Assign.h"
                      ,0x1f2,
                      "Derived &Eigen::DenseBase<Eigen::Matrix<int, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<int, -1, 1>, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>, Eigen::Matrix<int, -1, 1>>]"
                     );
      }
      uVar8 = uVar11 + 3;
      if (-1 < (long)uVar11) {
        uVar8 = uVar11;
      }
      uVar8 = uVar8 & 0xfffffffffffffffc;
      if (3 < (long)uVar11) {
        lVar9 = 0;
        do {
          piVar6 = (post->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data + lVar9;
          *piVar6 = local_68._4_4_;
          piVar6[1] = local_68._4_4_;
          piVar6[2] = local_68._4_4_;
          piVar6[3] = local_68._4_4_;
          lVar9 = lVar9 + 4;
        } while (lVar9 < (long)uVar8);
      }
      if ((long)uVar8 < (long)uVar11) {
        piVar6 = (post->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        do {
          piVar6[uVar8] = local_5c;
          uVar8 = uVar8 + 1;
        } while (uVar11 != uVar8);
      }
      DVar5 = local_48.m_rows;
      if (-1 < local_48.m_rows) {
        if (3 < (ulong)local_48.m_rows) {
          uVar11 = 0;
          do {
            piVar6 = local_48.m_data + uVar11;
            *piVar6 = -1;
            piVar6[1] = -1;
            piVar6[2] = -1;
            piVar6[3] = -1;
            uVar11 = uVar11 + 4;
          } while (uVar11 < (local_48.m_rows & 0x7ffffffffffffffcU));
        }
        if ((long)(local_48.m_rows & 0x7ffffffffffffffcU) < local_48.m_rows) {
          memset((void *)((local_48.m_rows * 4 & 0xfffffffffffffff0U) + (long)local_48.m_data),0xff,
                 (ulong)((uint)(local_48.m_rows * 4) & 0xc));
        }
        if (0 < n) {
          piVar6 = (parent->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
          lVar9 = (parent->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows;
          uVar8 = (ulong)(uint)n;
          uVar11 = uVar8;
          do {
            if ((((lVar9 < (long)uVar8) || (lVar10 = (long)piVar6[uVar11 - 1], lVar10 < 0)) ||
                (DVar5 <= lVar10)) || (local_58.m_rows < (long)uVar8)) {
              __assert_fail("index >= 0 && index < size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                            ,0x18a,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<int, -1, 1>, Level = 1]"
                           );
            }
            local_58.m_data[uVar11 - 1] = local_48.m_data[lVar10];
            local_48.m_data[lVar10] = (int)uVar11 + -1;
            bVar2 = 1 < uVar11;
            uVar11 = uVar11 - 1;
          } while (bVar2);
        }
        nr_etdfs<int,Eigen::Matrix<int,_1,1,0,_1,1>>
                  (n,parent,(Matrix<int,__1,_1,_0,__1,_1> *)&local_48,
                   (Matrix<int,__1,_1,_0,__1,_1> *)&local_58,post,0);
        free(local_58.m_data);
        free(local_48.m_data);
        return;
      }
    }
    __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x3f,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>, Eigen::Matrix<int, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<int>, MatrixType = Eigen::Matrix<int, -1, 1>]"
                 );
  }
  piVar6 = (int *)malloc(uVar11 * 4);
  if (piVar6 != (int *)0x0) {
    local_48.m_rows = uVar11;
    local_48.m_data = piVar6;
    piVar6 = (int *)malloc(uVar11 * 4);
    if (piVar6 != (int *)0x0) {
      local_58.m_rows = uVar11;
      local_58.m_data = piVar6;
      uVar8 = uVar11 & 0xfffffffffffffffc;
      if (3 < uVar1) {
        lVar9 = 0;
        do {
          *(undefined1 (*) [16])(piVar6 + lVar9) = (undefined1  [16])0x0;
          lVar9 = lVar9 + 4;
        } while (lVar9 < (long)uVar8);
      }
      goto LAB_0014ce9a;
    }
  }
  puVar7 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar7 = std::streambuf::xsgetn;
  __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void treePostorder(Index n, IndexVector& parent, IndexVector& post)
{
  IndexVector first_kid, next_kid; // Linked list of children 
  Index postnum; 
  // Allocate storage for working arrays and results 
  first_kid.resize(n+1); 
  next_kid.setZero(n+1);
  post.setZero(n+1);
  
  // Set up structure describing children
  Index v, dad; 
  first_kid.setConstant(-1); 
  for (v = n-1; v >= 0; v--) 
  {
    dad = parent(v);
    next_kid(v) = first_kid(dad); 
    first_kid(dad) = v; 
  }
  
  // Depth-first search from dummy root vertex #n
  postnum = 0; 
  internal::nr_etdfs(n, parent, first_kid, next_kid, post, postnum);
}